

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TiledRgbaOutputFile::ToYa::writeTile(ToYa *this,int dx,int dy,int lx,int ly)

{
  Rgba *pRVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  ArgExc *this_00;
  long lVar6;
  Rgba *rgbaIn;
  long lVar7;
  undefined1 in_R10B;
  long lVar8;
  int iVar9;
  long lVar10;
  Box2i dw;
  FrameBuffer fb;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  if (this->_fbBase != (Rgba *)0x0) {
    TiledOutputFile::dataWindowForTile((TiledOutputFile *)&dw,(int)this->_outputFile,dx,dy,lx);
    if (dw.min.y <= dw.max.y) {
      iVar9 = dw.max.x - dw.min.x;
      pRVar1 = this->_fbBase;
      lVar8 = 0;
      lVar7 = 0;
      lVar10 = (long)dw.min.y;
      do {
        if (dw.min.x <= dw.max.x) {
          lVar6 = 0;
          lVar3 = (long)dw.min.x;
          do {
            *(Rgba *)((long)&(((this->_buf)._data)->r)._h + lVar6 + (this->_buf)._sizeY * lVar8) =
                 pRVar1[this->_fbYStride * lVar10 + this->_fbXStride * lVar3];
            lVar6 = lVar6 + 8;
            bVar2 = lVar3 < dw.max.x;
            lVar3 = lVar3 + 1;
          } while (bVar2);
        }
        rgbaIn = (this->_buf)._data + (this->_buf)._sizeY * lVar7;
        RgbaYca::RGBAtoYCA(&this->_yw,iVar9 + 1,this->_writeA,rgbaIn,rgbaIn);
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 8;
        bVar2 = lVar10 < dw.max.y;
        lVar10 = lVar10 + 1;
      } while (bVar2);
    }
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Slice::Slice((Slice *)&_iex_throw_s,HALF,
                 (char *)&(this->_buf)._data[-(long)dw.min.y * (this->_buf)._sizeY - (long)dw.min.x]
                          .g,8,(ulong)this->_tileXSize << 3,1,1,0.0,(bool)in_R10B,false);
    FrameBuffer::insert(&fb,"Y",(Slice *)&_iex_throw_s);
    Slice::Slice((Slice *)&_iex_throw_s,HALF,
                 (char *)&(this->_buf)._data[-(long)dw.min.y * (this->_buf)._sizeY - (long)dw.min.x]
                          .a,8,(ulong)this->_tileXSize << 3,1,1,0.0,(bool)in_R10B,false);
    FrameBuffer::insert(&fb,"A",(Slice *)&_iex_throw_s);
    TiledOutputFile::setFrameBuffer(this->_outputFile,&fb);
    TiledOutputFile::writeTile(this->_outputFile,dx,dy,lx,ly);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&fb);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"No frame buffer was specified as the pixel data source for image file \"",
             0x47);
  pcVar4 = TiledOutputFile::fileName(this->_outputFile);
  poVar5 = std::operator<<(local_1a8,pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TiledRgbaOutputFile::ToYa::writeTile (int dx, int dy, int lx, int ly)
{
    if (_fbBase == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "No frame buffer was specified as the "
            "pixel data source for image file "
            "\"" << _outputFile.fileName ()
                 << "\".");
    }

    //
    // Copy the tile's RGBA pixels into _buf and convert
    // them to luminance/alpha format
    //

    Box2i dw    = _outputFile.dataWindowForTile (dx, dy, lx, ly);
    int   width = dw.max.x - dw.min.x + 1;

    intptr_t base = reinterpret_cast<intptr_t> (_fbBase);
    for (int y = dw.min.y, y1 = 0; y <= dw.max.y; ++y, ++y1)
    {
        for (int x = dw.min.x, x1 = 0; x <= dw.max.x; ++x, ++x1)
        {
            Rgba* ptr = reinterpret_cast<Rgba*> (
                base + sizeof (Rgba) * (x * _fbXStride + y * _fbYStride));
            _buf[y1][x1] = *ptr;
        }
        RGBAtoYCA (_yw, width, _writeA, _buf[y1], _buf[y1]);
    }

    //
    // Store the contents of _buf in the output file
    //

    FrameBuffer fb;

    fb.insert (
        "Y",
        Slice (
            HALF,                                  // type
            (char*) &_buf[-dw.min.y][-dw.min.x].g, // base
            sizeof (Rgba),                         // xStride
            sizeof (Rgba) * _tileXSize));          // yStride

    fb.insert (
        "A",
        Slice (
            HALF,                                  // type
            (char*) &_buf[-dw.min.y][-dw.min.x].a, // base
            sizeof (Rgba),                         // xStride
            sizeof (Rgba) * _tileXSize));          // yStride

    _outputFile.setFrameBuffer (fb);
    _outputFile.writeTile (dx, dy, lx, ly);
}